

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall ConnmanTestMsg::ClearTestNodes(ConnmanTestMsg *this)

{
  long lVar1;
  pointer ppCVar2;
  CNode *this_00;
  pointer ppCVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock15,&(this->super_CConnman).m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/net.h"
             ,0x3f,false);
  ppCVar2 = (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->super_CConnman).m_nodes.
                 super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar3 != ppCVar2; ppCVar3 = ppCVar3 + 1) {
    this_00 = *ppCVar3;
    if (this_00 != (CNode *)0x0) {
      CNode::~CNode(this_00);
    }
    operator_delete(this_00,0x3a8);
  }
  ppCVar3 = (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar3;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ClearTestNodes()
    {
        LOCK(m_nodes_mutex);
        for (CNode* node : m_nodes) {
            delete node;
        }
        m_nodes.clear();
    }